

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O2

void IO_ENTRYINFO(EventEnum entryid)

{
  char *pcVar1;
  void *from;
  uint32 x;
  int iVar2;
  uint x_00;
  char *pcVar3;
  undefined8 *__ptr;
  char *pcVar4;
  char *pcVar5;
  pthread_t x_01;
  ulong uVar6;
  int iVar7;
  void *local_358;
  ulong local_350;
  void *callstack [34];
  void *new_strings_ptrs [32];
  char *new_strings [32];
  ulong uVar8;
  
  x = now();
  iVar2 = backtrace(callstack,0x20);
  iVar7 = 2;
  if (2 < iVar2) {
    iVar7 = iVar2;
  }
  uVar8 = (ulong)(iVar7 - 2);
  uVar6 = 0;
  x_00 = 0;
  local_350 = uVar8;
  do {
    if (uVar6 == uVar8) {
LAB_00103e2d:
      if (0 < (int)x_00) {
        writele32(3);
        writele32(x_00);
        for (uVar6 = 0; x_00 != uVar6; uVar6 = uVar6 + 1) {
          IO_UINT64((uint64)new_strings_ptrs[uVar6]);
          IO_STRING(new_strings[uVar6]);
        }
      }
      writele32(entryid);
      writele32(x);
      x_01 = pthread_self();
      IO_UINT64(x_01);
      writele32((uint32)uVar8);
      for (uVar6 = 0; (uVar8 & 0xffffffff) != uVar6; uVar6 = uVar6 + 1) {
        IO_UINT64((uint64)callstack[uVar6 + 2]);
      }
      return;
    }
    from = callstack[uVar6 + 2];
    local_358 = from;
    pcVar3 = get_mapped_stackframe(from);
    if (pcVar3 == (char *)0x0) {
      __ptr = (undefined8 *)backtrace_symbols(&local_358,1);
      pcVar5 = (char *)*__ptr;
      if (pcVar5 == (char *)0x0) {
        pcVar5 = (char *)0x0;
      }
      else {
        pcVar4 = pcVar5;
        if (*pcVar5 == '0') {
          do {
            pcVar5 = pcVar4 + 1;
            pcVar1 = pcVar4 + 1;
            pcVar4 = pcVar5;
          } while (*pcVar1 == ' ');
        }
        pcVar5 = strdup(pcVar5);
      }
      free(__ptr);
      uVar8 = local_350;
      if (pcVar5 == (char *)0x0) goto LAB_00103d8e;
      add_stackframe_to_map(local_358,pcVar5);
      new_strings[(int)x_00] = pcVar5;
      new_strings_ptrs[(int)x_00] = from;
      x_00 = x_00 + 1;
    }
    else {
LAB_00103d8e:
      if (pcVar3 == (char *)0x0) {
        uVar8 = uVar6 & 0xffffffff;
        goto LAB_00103e2d;
      }
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

__attribute__((noinline)) static void IO_ENTRYINFO(const EventEnum entryid)
{
    const uint32 currentms = now();
    void* callstack[MAX_CALLSTACKS + 2];
    char *new_strings[MAX_CALLSTACKS];
    void *new_strings_ptrs[MAX_CALLSTACKS];
    int frames = backtrace(callstack, MAX_CALLSTACKS);
    int num_new_strings = 0;
    int i;

    frames -= 2;  // skip IO_ENTRYINFO and entry point.
    if (frames < 0) {
        frames = 0;
    }

    for (i = 0; i < frames; i++) {
        int seen_before = 0;
        void *ptr = callstack[i + 2];
        char *str = get_callstack_sym(ptr, &seen_before);
        if ((str == NULL) && !seen_before) {
            break;
        }

        if (!seen_before) {
            new_strings[num_new_strings] = str;
            new_strings_ptrs[num_new_strings] = ptr;
            num_new_strings++;
        }
    }
    frames = i;  /* in case we stopped early. */

    if (num_new_strings > 0) {
        IO_EVENTENUM(ALEE_NEW_CALLSTACK_SYMS);
        IO_UINT32((uint32) num_new_strings);
        for (i = 0; i < num_new_strings; i++) {
            IO_PTR(new_strings_ptrs[i]);
            IO_STRING(new_strings[i]);
        }
    }

    IO_EVENTENUM(entryid);
    IO_UINT32(currentms);
    IO_UINT64((uint64) pthread_self());

    IO_UINT32((uint32) frames);
    for (i = 0; i < frames; i++) {
        IO_PTR(callstack[i + 2]);
    }
}